

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-getaddrinfo.c
# Opt level: O2

void getaddrinfo_cb(uv_getaddrinfo_t *handle,int status,addrinfo *res)

{
  if (status == 0) {
    calls_completed = calls_completed + 1;
    if (calls_initiated < 10000) {
      getaddrinfo_initiate(handle);
    }
    uv_freeaddrinfo(res);
    return;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-getaddrinfo.c"
          ,0x2e,"status == 0");
  abort();
}

Assistant:

static void getaddrinfo_cb(uv_getaddrinfo_t* handle, int status,
    struct addrinfo* res) {
  ASSERT(status == 0);
  calls_completed++;
  if (calls_initiated < TOTAL_CALLS) {
    getaddrinfo_initiate(handle);
  }

  uv_freeaddrinfo(res);
}